

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapePermuteLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RangeValue *pRVar1;
  RepeatedField<unsigned_long> *this_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined7 uVar7;
  bool bVar8;
  undefined7 uVar9;
  unsigned_long uVar10;
  LogMessage *pLVar11;
  mapped_type *pmVar12;
  ShapeRange *pSVar13;
  unsigned_long *puVar14;
  runtime_error *this_01;
  undefined1 *from;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> outranges;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  PermuteLayerParams permute;
  allocator_type local_259;
  mapped_type *local_258;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> local_250;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> local_238;
  unsigned_long local_220;
  LogMessage local_218;
  PermuteLayerParams local_1e0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            (&local_238,4,(allocator_type *)&local_218);
  pSVar13 = ShapeConstraint::sequenceRange(pmVar12);
  bVar8 = (pSVar13->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
  sVar5 = (pSVar13->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
  sVar6 = (pSVar13->_maximum)._val;
  ((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._isUnbound = (pSVar13->_maximum)._isUnbound;
  *(undefined7 *)
   &((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_maximum).field_0x1 = uVar7;
  ((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._val = sVar6;
  ((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._isUnbound = bVar8;
  *(undefined7 *)
   &((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_minimum).field_0x1 = uVar9;
  ((local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._val = sVar5;
  pSVar13 = ShapeConstraint::channelRange(pmVar12);
  bVar8 = (pSVar13->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
  sVar5 = (pSVar13->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
  sVar6 = (pSVar13->_maximum)._val;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._isUnbound = (pSVar13->_maximum)._isUnbound;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._maximum.field_0x1 = uVar7;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._val = sVar6;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._minimum.field_0x1 = uVar9;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._val = sVar5;
  pSVar13 = ShapeConstraint::heightRange(pmVar12);
  bVar8 = (pSVar13->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
  sVar5 = (pSVar13->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
  sVar6 = (pSVar13->_maximum)._val;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._isUnbound = (pSVar13->_maximum)._isUnbound;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._maximum.field_0x1 = uVar7;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._val = sVar6;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._minimum.field_0x1 = uVar9;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._val = sVar5;
  pSVar13 = ShapeConstraint::widthRange(pmVar12);
  bVar8 = (pSVar13->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
  sVar5 = (pSVar13->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
  sVar6 = (pSVar13->_maximum)._val;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._isUnbound = (pSVar13->_maximum)._isUnbound;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._maximum.field_0x1 = uVar7;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._val = sVar6;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._minimum.field_0x1 = uVar9;
  local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._val = sVar5;
  if (specLayer->_oneof_case_[0] == 0x136) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_PermuteLayerParams_default_instance_;
  }
  local_258 = pmVar12;
  Specification::PermuteLayerParams::PermuteLayerParams(&local_1e0,(PermuteLayerParams *)from);
  if (local_1e0.axis_.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  this_00 = &local_1e0.axis_;
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  local_220 = *puVar14;
  if (local_1e0.axis_.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar2 = puVar14[1];
  if (local_1e0.axis_.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar3 = puVar14[2];
  if (local_1e0.axis_.current_size_ < 4) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  puVar14 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar4 = puVar14[3];
  if ((uVar3 | uVar4 | uVar2 | local_220) < 4) {
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,
                           (key_type *)
                           ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_218,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    ShapeConstraint::setName
              (pmVar12,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
              );
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_218,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          (&local_218,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_250,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage(&local_218);
    }
    ShapeConstraint::setName
              (pmVar12,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
              );
    uVar10 = local_220;
    ShapeConstraint::updateSequenceRange
              (pmVar12,local_238.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_220);
    ShapeConstraint::updateChannelRange
              (pmVar12,local_238.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar2);
    ShapeConstraint::updateHeightRange
              (pmVar12,local_238.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar3);
    ShapeConstraint::updateWidthRange
              (pmVar12,local_238.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar4);
    std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
              (&local_250,4,&local_259);
    pSVar13 = ShapeConstraint::sequenceRange(pmVar12);
    bVar8 = (pSVar13->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
    sVar5 = (pSVar13->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
    sVar6 = (pSVar13->_maximum)._val;
    pRVar1 = &local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar10]._maximum;
    pRVar1->_isUnbound = (pSVar13->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar13 = local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar10;
    (pSVar13->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar13->_minimum).field_0x1 = uVar9;
    (pSVar13->_minimum)._val = sVar5;
    pSVar13 = ShapeConstraint::channelRange(pmVar12);
    bVar8 = (pSVar13->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
    sVar5 = (pSVar13->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
    sVar6 = (pSVar13->_maximum)._val;
    pRVar1 = &local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar2]._maximum;
    pRVar1->_isUnbound = (pSVar13->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar13 = local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar2;
    (pSVar13->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar13->_minimum).field_0x1 = uVar9;
    (pSVar13->_minimum)._val = sVar5;
    pSVar13 = ShapeConstraint::heightRange(pmVar12);
    bVar8 = (pSVar13->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
    sVar5 = (pSVar13->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
    sVar6 = (pSVar13->_maximum)._val;
    pRVar1 = &local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar3]._maximum;
    pRVar1->_isUnbound = (pSVar13->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar13 = local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar3;
    (pSVar13->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar13->_minimum).field_0x1 = uVar9;
    (pSVar13->_minimum)._val = sVar5;
    pSVar13 = ShapeConstraint::widthRange(pmVar12);
    bVar8 = (pSVar13->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar13->_minimum).field_0x1;
    sVar5 = (pSVar13->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar13->_maximum).field_0x1;
    sVar6 = (pSVar13->_maximum)._val;
    pRVar1 = &local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4]._maximum;
    pRVar1->_isUnbound = (pSVar13->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar13 = local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
              _M_impl.super__Vector_impl_data._M_start + uVar4;
    (pSVar13->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar13->_minimum).field_0x1 = uVar9;
    (pSVar13->_minimum)._val = sVar5;
    ShapeConstraint::updateSequenceRange
              (local_258,
               local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ShapeConstraint::updateChannelRange
              (local_258,
               local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    ShapeConstraint::updateHeightRange
              (local_258,
               local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
               ._M_impl.super__Vector_impl_data._M_start + 2);
    ShapeConstraint::updateWidthRange
              (local_258,
               local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
               ._M_impl.super__Vector_impl_data._M_start + 3);
    pSVar13 = ShapeConstraint::batchRange(pmVar12);
    ShapeConstraint::updateBatchRange(local_258,pSVar13);
    if (local_250.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
        _M_impl.super__Vector_impl_data._M_start != (ShapeRange *)0x0) {
      operator_delete(local_250.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_250.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_250.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Specification::PermuteLayerParams::~PermuteLayerParams(&local_1e0);
    if (local_238.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_238.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_238.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_238.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"Ranges axis index is out of bounds in shapePermuteLayer.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NeuralNetworkShaper::shapePermuteLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    std::vector<ShapeRange> ranges(4);
    ranges[0] = inputShape.sequenceRange();
    ranges[1] = inputShape.channelRange();
    ranges[2] = inputShape.heightRange();
    ranges[3] = inputShape.widthRange();

    Specification::PermuteLayerParams permute = specLayer.permute();
    size_t axis0 = static_cast<size_t>(permute.axis(0));
    size_t axis1 = static_cast<size_t>(permute.axis(1));
    size_t axis2 = static_cast<size_t>(permute.axis(2));
    size_t axis3 = static_cast<size_t>(permute.axis(3));
    
    // Check that indices into "ranges" and "outranges" are not out of bounds.
    if (axis0 > 3 || axis1 > 3 || axis2 > 3 || axis3 > 3) {
        throw std::runtime_error("Ranges axis index is out of bounds in shapePermuteLayer.");
    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.setName(specLayer.output(0));
    outputShape.updateSequenceRange(ranges[axis0]);
    outputShape.updateChannelRange(ranges[axis1]);
    outputShape.updateHeightRange(ranges[axis2]);
    outputShape.updateWidthRange(ranges[axis3]);

    // Need for the reverse pass as well
    std::vector<ShapeRange> outranges(4);
    outranges[axis0] = outputShape.sequenceRange();
    outranges[axis1] = outputShape.channelRange();
    outranges[axis2] = outputShape.heightRange();
    outranges[axis3] = outputShape.widthRange();

    // Need the constraints to go both ways here
    inputShape.updateSequenceRange(outranges[0]);
    inputShape.updateChannelRange(outranges[1]);
    inputShape.updateHeightRange(outranges[2]);
    inputShape.updateWidthRange(outranges[3]);

    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif
    
}